

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exporter.cpp
# Opt level: O0

bool __thiscall FSSExporter::do_export(FSSExporter *this)

{
  Resource res_00;
  Type TVar1;
  ulong uVar2;
  char *pcVar3;
  Resource resource;
  Resource resource_00;
  string local_1b0;
  QVariant local_190;
  string local_170;
  QString local_150;
  QString local_138;
  QString local_120;
  QString local_108;
  Resource local_ec;
  Resource RStack_e8;
  Resource res;
  size_t r;
  QString local_c0;
  QString local_a8;
  QVariant local_90;
  QString local_70;
  QString local_48;
  undefined1 local_30 [8];
  QSettings meta_file;
  QDir local_20 [8];
  FSSExporter *local_18;
  FSSExporter *this_local;
  
  local_18 = this;
  QDir::QDir(local_20,&this->path);
  QDir::operator=(&this->dir,local_20);
  QDir::~QDir(local_20);
  uVar2 = QDir::exists();
  if ((uVar2 & 1) == 0) {
    this_local._7_1_ = 0;
  }
  else {
    operator+(&local_48,&this->path,"/meta.ini");
    QSettings::QSettings((QSettings *)local_30,&local_48,IniFormat,(QObject *)0x0);
    QString::~QString(&local_48);
    QString::QString(&local_70,"scale");
    QString::number((int)&local_a8,this->scale);
    QVariant::QVariant(&local_90,&local_a8);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_70);
    QVariant::~QVariant(&local_90);
    QString::~QString(&local_a8);
    QString::~QString(&local_70);
    QString::QString(&local_c0,"name");
    pcVar3 = (char *)std::__cxx11::string::c_str();
    QVariant::QVariant((QVariant *)&r,pcVar3);
    QSettings::setValue((QString *)local_30,(QVariant *)&local_c0);
    QVariant::~QVariant((QVariant *)&r);
    QString::~QString(&local_c0);
    for (_RStack_e8 = 1; _RStack_e8 < 0x22; _RStack_e8 = _RStack_e8 + 1) {
      local_ec = RStack_e8;
      TVar1 = Data::get_resource_type(RStack_e8);
      res_00 = local_ec;
      switch(TVar1) {
      case TypeSprite:
        exportResourceSprite(this,local_ec);
        break;
      case TypeAnimation:
        exportResourceAnimation(this,local_ec);
        break;
      case TypeSound:
        QString::QString(&local_108,"wav");
        exportResourceData(this,res_00,&local_108);
        QString::~QString(&local_108);
        break;
      case TypeMusic:
        QString::QString(&local_120,"mid");
        exportResourceData(this,res_00,&local_120);
        QString::~QString(&local_120);
      }
      QString::QString(&local_150,"resources/");
      Data::get_resource_name_abi_cxx11_(&local_170,(Data *)(ulong)local_ec,resource);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      operator+(&local_138,&local_150,pcVar3);
      Data::get_resource_name_abi_cxx11_(&local_1b0,(Data *)(ulong)local_ec,resource_00);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      QVariant::QVariant(&local_190,pcVar3);
      QSettings::setValue((QString *)local_30,(QVariant *)&local_138);
      QVariant::~QVariant(&local_190);
      std::__cxx11::string::~string((string *)&local_1b0);
      QString::~QString(&local_138);
      std::__cxx11::string::~string((string *)&local_170);
      QString::~QString(&local_150);
    }
    this_local._7_1_ = 1;
    QSettings::~QSettings((QSettings *)local_30);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool
FSSExporter::do_export() {
  dir = QDir(path);
  if (!dir.exists()) {
    return false;
  }

  QSettings meta_file(path + "/meta.ini", QSettings::IniFormat);

  meta_file.setValue("scale", QString::number(scale));
  meta_file.setValue("name", name.c_str());

  for (size_t r = Data::AssetArtLandscape; r <= Data::AssetCursor; r++) {
    Data::Resource res = static_cast<Data::Resource>(r);
    switch (Data::get_resource_type(res)) {
      case Data::TypeSprite: {
        exportResourceSprite(res);
        break;
      }
      case Data::TypeAnimation: {
        exportResourceAnimation(res);
        break;
      }
      case Data::TypeSound: {
        exportResourceData(res, "wav");
        break;
      }
      case Data::TypeMusic: {
        exportResourceData(res, "mid");
        break;
      }
      default: {
        break;
      }
    }
    meta_file.setValue(QString("resources/")
                       + Data::get_resource_name(res).c_str(),
                       Data::get_resource_name(res).c_str());
  }

  return true;
}